

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

void __thiscall Widget::writeXmlChildren(Widget *this,stringstream *str,int indent)

{
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference ppWVar4;
  Util local_90 [32];
  string local_70 [32];
  int local_50;
  int i;
  Util local_40 [36];
  int local_1c;
  stringstream *psStack_18;
  int indent_local;
  stringstream *str_local;
  Widget *this_local;
  
  local_1c = indent;
  psStack_18 = str;
  str_local = (stringstream *)this;
  Util::getIndent_abi_cxx11_(local_40,indent);
  poVar1 = std::operator<<((ostream *)(str + 0x10),(string *)local_40);
  poVar1 = std::operator<<(poVar1,"<Widgets>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_40);
  local_50 = 0;
  while( true ) {
    uVar2 = (ulong)local_50;
    sVar3 = std::vector<Widget_*,_std::allocator<Widget_*>_>::size(&this->children);
    if (sVar3 <= uVar2) break;
    poVar1 = (ostream *)(psStack_18 + 0x10);
    ppWVar4 = std::vector<Widget_*,_std::allocator<Widget_*>_>::operator[]
                        (&this->children,(long)local_50);
    (**(*ppWVar4)->_vptr_Widget)(local_70,*ppWVar4,(ulong)(local_1c + 1));
    poVar1 = std::operator<<(poVar1,local_70);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_70);
    local_50 = local_50 + 1;
  }
  poVar1 = (ostream *)(psStack_18 + 0x10);
  Util::getIndent_abi_cxx11_(local_90,local_1c);
  poVar1 = std::operator<<(poVar1,(string *)local_90);
  poVar1 = std::operator<<(poVar1,"</Widgets>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void Widget::writeXmlChildren(std::stringstream& str, int indent) const
{
	str << Util::getIndent(indent) << "<Widgets>" << std::endl;
	for (int i = 0; i < children.size(); i++)
	{
		str << children[i]->writeXml(indent + 1) << std::endl;
	}
	str << Util::getIndent(indent) << "</Widgets>" << std::endl;
}